

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsq.hpp
# Opt level: O2

Array * __thiscall tf::UnboundedTaskQueue<void_*>::Array::resize(Array *this,int64_t b,int64_t t)

{
  Array *this_00;
  int64_t i;
  
  this_00 = (Array *)operator_new(0x18);
  Array(this_00,this->C * 2);
  for (; b != t; t = t + 1) {
    this_00->S[this_00->M & t]._M_b._M_p = this->S[this->M & t]._M_b._M_p;
  }
  return this_00;
}

Assistant:

Array* resize(int64_t b, int64_t t) {
      Array* ptr = new Array {2*C};
      for(int64_t i=t; i!=b; ++i) {
        ptr->push(i, pop(i));
      }
      return ptr;
    }